

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<TFad<6,_double>_>::Subst_Forward
          (TPZMatrix<TFad<6,_double>_> *this,TPZFMatrix<TFad<6,_double>_> *B)

{
  undefined **ppuVar1;
  undefined **ppuVar2;
  int iVar3;
  undefined4 extraout_var;
  int extraout_var_00;
  long lVar4;
  undefined4 extraout_var_01;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  TFad<6,_double> pivot;
  undefined **local_130;
  double local_128;
  undefined **appuStack_120 [7];
  double local_e8;
  undefined **appuStack_e0 [6];
  undefined1 local_b0 [8];
  double local_a8;
  undefined **appuStack_a0 [6];
  undefined1 local_70 [8];
  double local_68;
  double adStack_60 [6];
  
  lVar8 = (B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow;
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar5 = 0;
  if ((lVar8 == CONCAT44(extraout_var,iVar3)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    iVar5 = 1;
    if (CONCAT44(extraout_var_00,iVar3) != 0 && -1 < extraout_var_00) {
      lVar8 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (local_70,this,lVar8,lVar8);
        if (0 < (B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol) {
          lVar6 = 0;
          do {
            local_130 = &PTR__TFad_0185d2b8;
            appuStack_120[3] = (undefined **)0x0;
            appuStack_120[4] = (undefined **)0x0;
            appuStack_120[1] = (undefined **)0x0;
            appuStack_120[2] = (undefined **)0x0;
            local_128 = 0.0;
            appuStack_120[0] = (undefined **)0x0;
            appuStack_120[5] = (undefined **)0x0;
            if (lVar8 == 0) {
              dVar9 = 0.0;
            }
            else {
              dVar9 = 0.0;
              lVar7 = 0;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (appuStack_120 + 6,this,lVar8,lVar7);
                (*(B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x24])(local_b0,B,lVar7,lVar6);
                lVar4 = 2;
                do {
                  ppuVar1 = appuStack_e0[lVar4 + -1];
                  ppuVar2 = appuStack_e0[lVar4 + 7];
                  (&local_130)[lVar4] =
                       (undefined **)
                       ((double)(&local_130)[lVar4] +
                       (double)appuStack_e0[lVar4 + 6] * local_e8 +
                       (double)appuStack_120[lVar4 + 6] * local_a8);
                  (&local_130)[lVar4 + 1] =
                       (undefined **)
                       ((double)(&local_130)[lVar4 + 1] +
                       (double)ppuVar2 * local_e8 + (double)ppuVar1 * local_a8);
                  lVar4 = lVar4 + 2;
                } while (lVar4 != 8);
                dVar9 = local_a8 * local_e8 + dVar9;
                lVar7 = lVar7 + 1;
              } while (lVar7 != lVar8);
            }
            local_128 = dVar9;
            (*(B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(local_b0,B,lVar8,lVar6);
            appuStack_120[6] = &PTR__TFad_0185d2b8;
            dVar9 = local_a8 - local_128;
            local_e8 = dVar9 / local_68;
            lVar7 = 0;
            do {
              auVar10._0_8_ =
                   (*(double *)((long)appuStack_a0 + lVar7) -
                   *(double *)((long)appuStack_120 + lVar7)) * local_68 -
                   *(double *)((long)adStack_60 + lVar7) * dVar9;
              auVar10._8_8_ =
                   (*(double *)((long)appuStack_a0 + lVar7 + 8) -
                   *(double *)((long)appuStack_120 + lVar7 + 8)) * local_68 -
                   *(double *)((long)adStack_60 + lVar7 + 8) * dVar9;
              auVar11._8_8_ = local_68 * local_68;
              auVar11._0_8_ = local_68 * local_68;
              auVar11 = divpd(auVar10,auVar11);
              *(undefined1 (*) [16])((long)appuStack_e0 + lVar7) = auVar11;
              lVar7 = lVar7 + 0x10;
            } while (lVar7 != 0x30);
            (*(B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(B,lVar8,lVar6,appuStack_120 + 6);
            lVar6 = lVar6 + 1;
          } while (lVar6 < (B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol);
        }
        lVar8 = lVar8 + 1;
        iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
      } while (lVar8 < CONCAT44(extraout_var_01,iVar3));
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}